

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idna.c
# Opt level: O2

int uv__idna_toascii_label(char *s,char *se,char **d,char *de)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  char *pcVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  int iVar15;
  char *s_local;
  int local_54;
  int local_50;
  uint local_4c;
  ulong local_48;
  char *local_40;
  char *local_38;
  
  uVar7 = 0;
  iVar9 = 0;
  pcVar8 = de;
  s_local = s;
  local_40 = s;
  while( true ) {
    if (s <= se) {
      uVar4 = uv__utf8_decode1(&s_local,se);
      pcVar8 = (char *)(ulong)uVar4;
      s = s_local;
    }
    iVar15 = (int)uVar7;
    if (se < s) break;
    if ((uint)pcVar8 < 0x80) {
      uVar7 = (ulong)(iVar15 + 1);
    }
    else {
      if ((uint)pcVar8 == 0xffffffff) {
        return -0x16;
      }
      iVar9 = iVar9 + 1;
    }
  }
  if (iVar9 != 0) {
    pcVar12 = *d;
    if (pcVar12 < de) {
      *d = pcVar12 + 1;
      *pcVar12 = 'x';
      pcVar12 = *d;
    }
    if (pcVar12 < de) {
      *d = pcVar12 + 1;
      *pcVar12 = 'n';
      pcVar12 = *d;
    }
    if (pcVar12 < de) {
      *d = pcVar12 + 1;
      *pcVar12 = '-';
      pcVar12 = *d;
    }
    if (pcVar12 < de) {
      *d = pcVar12 + 1;
      *pcVar12 = '-';
    }
  }
  s_local = local_40;
  iVar10 = 0;
  pcVar12 = local_40;
  local_54 = iVar9;
  do {
    do {
      if (pcVar12 <= se) {
        uVar4 = uv__utf8_decode1(&s_local,se);
        pcVar8 = (char *)(ulong)uVar4;
        pcVar12 = s_local;
      }
      if (se < pcVar12) goto LAB_00109a0c;
    } while (0x7f < (uint)pcVar8);
    pcVar6 = *d;
    if (pcVar6 < de) {
      *d = pcVar6 + 1;
      *pcVar6 = (char)pcVar8;
    }
    iVar10 = iVar10 + 1;
  } while (iVar10 != iVar15);
LAB_00109a0c:
  if (local_54 != 0) {
    if ((iVar15 != 0) && (pcVar12 = *d, pcVar12 < de)) {
      *d = pcVar12 + 1;
      *pcVar12 = '-';
    }
    uVar4 = 0x48;
    uVar11 = 0x80;
    local_4c = 0;
    local_50 = 1;
    local_48 = uVar7;
    local_38 = de;
    while (iVar9 = local_54, local_54 != 0) {
      s_local = local_40;
      pcVar12 = (char *)0xffffffffffffffff;
      pcVar6 = local_40;
      while( true ) {
        if (pcVar6 <= se) {
          uVar5 = uv__utf8_decode1(&s_local,se);
          pcVar8 = (char *)(ulong)uVar5;
          pcVar6 = s_local;
        }
        pcVar3 = local_38;
        uVar5 = (uint)pcVar12;
        if (se < pcVar6) break;
        pcVar3 = pcVar12;
        if ((uint)pcVar8 < uVar5) {
          pcVar3 = pcVar8;
        }
        if (uVar11 <= (uint)pcVar8) {
          pcVar12 = pcVar3;
        }
        pcVar12 = (char *)((ulong)pcVar12 & 0xffffffff);
      }
      uVar13 = (int)local_48 + 1;
      if (~local_4c / uVar13 < uVar5 - uVar11) {
        return -7;
      }
      uVar11 = (uVar5 - uVar11) * uVar13 + local_4c;
      s_local = local_40;
      pcVar6 = local_40;
      local_54 = iVar9;
      while( true ) {
        if (pcVar6 <= se) {
          uVar13 = uv__utf8_decode1(&s_local,se);
          pcVar8 = (char *)(ulong)uVar13;
          pcVar6 = s_local;
        }
        if (se < pcVar6) break;
        if (((uint)pcVar8 < uVar5) && (uVar11 = uVar11 + 1, uVar11 == 0)) {
          return -7;
        }
        if ((uint)pcVar8 == uVar5) {
          uVar13 = 0x24;
          uVar7 = (ulong)uVar11;
          while( true ) {
            uVar14 = uVar13 - uVar4;
            if (0x19 < uVar14) {
              uVar14 = 0x1a;
            }
            if (uVar13 <= uVar4) {
              uVar14 = 1;
            }
            if ((uint)uVar7 < uVar14) break;
            uVar2 = (ulong)((uint)uVar7 - uVar14);
            uVar7 = uVar2 / (0x24 - uVar14);
            pcVar8 = *d;
            if (pcVar8 < pcVar3) {
              cVar1 = "abcdefghijklmnopqrstuvwxyz0123456789"
                      [(ulong)uVar14 + uVar2 % (ulong)(0x24 - uVar14)];
              *d = pcVar8 + 1;
              *pcVar8 = cVar1;
            }
            uVar13 = uVar13 + 0x24;
          }
          pcVar8 = *d;
          if (pcVar8 < pcVar3) {
            cVar1 = "abcdefghijklmnopqrstuvwxyz0123456789"[uVar7];
            *d = pcVar8 + 1;
            *pcVar8 = cVar1;
          }
          iVar9 = 0;
          uVar7 = (ulong)uVar11 / 700;
          if (local_50 == 0) {
            uVar7 = (ulong)(uVar11 >> 1);
          }
          local_48 = (ulong)((int)local_48 + 1);
          for (uVar4 = (int)(uVar7 / local_48) + (int)uVar7; 0x1c7 < uVar4; uVar4 = uVar4 / 0x23) {
            iVar9 = iVar9 + 0x24;
          }
          uVar11 = 0;
          uVar4 = iVar9 + (uVar4 * 0x24 & 0xffff) / (uVar4 + 0x26 & 0xffff);
          local_54 = local_54 + -1;
          pcVar8 = (char *)((ulong)pcVar12 & 0xffffffff);
          local_50 = 0;
        }
      }
      local_4c = uVar11 + 1;
      uVar11 = uVar5 + 1;
    }
    iVar15 = 0;
  }
  return iVar15;
}

Assistant:

static int uv__idna_toascii_label(const char* s, const char* se,
                                  char** d, char* de) {
  static const char alphabet[] = "abcdefghijklmnopqrstuvwxyz0123456789";
  const char* ss;
  unsigned c;
  unsigned h;
  unsigned k;
  unsigned n;
  unsigned m;
  unsigned q;
  unsigned t;
  unsigned x;
  unsigned y;
  unsigned bias;
  unsigned delta;
  unsigned todo;
  int first;

  h = 0;
  ss = s;
  todo = 0;

  foreach_codepoint(c, &s, se) {
    if (c < 128)
      h++;
    else if (c == (unsigned) -1)
      return UV_EINVAL;
    else
      todo++;
  }

  if (todo > 0) {
    if (*d < de) *(*d)++ = 'x';
    if (*d < de) *(*d)++ = 'n';
    if (*d < de) *(*d)++ = '-';
    if (*d < de) *(*d)++ = '-';
  }

  x = 0;
  s = ss;
  foreach_codepoint(c, &s, se) {
    if (c > 127)
      continue;

    if (*d < de)
      *(*d)++ = c;

    if (++x == h)
      break;  /* Visited all ASCII characters. */
  }

  if (todo == 0)
    return h;

  /* Only write separator when we've written ASCII characters first. */
  if (h > 0)
    if (*d < de)
      *(*d)++ = '-';

  n = 128;
  bias = 72;
  delta = 0;
  first = 1;

  while (todo > 0) {
    m = -1;
    s = ss;
    foreach_codepoint(c, &s, se)
      if (c >= n)
        if (c < m)
          m = c;

    x = m - n;
    y = h + 1;

    if (x > ~delta / y)
      return UV_E2BIG;  /* Overflow. */

    delta += x * y;
    n = m;

    s = ss;
    foreach_codepoint(c, &s, se) {
      if (c < n)
        if (++delta == 0)
          return UV_E2BIG;  /* Overflow. */

      if (c != n)
        continue;

      for (k = 36, q = delta; /* empty */; k += 36) {
        t = 1;

        if (k > bias)
          t = k - bias;

        if (t > 26)
          t = 26;

        if (q < t)
          break;

        /* TODO(bnoordhuis) Since 1 <= t <= 26 and therefore
         * 10 <= y <= 35, we can optimize the long division
         * into a table-based reciprocal multiplication.
         */
        x = q - t;
        y = 36 - t;  /* 10 <= y <= 35 since 1 <= t <= 26. */
        q = x / y;
        t = t + x % y;  /* 1 <= t <= 35 because of y. */

        if (*d < de)
          *(*d)++ = alphabet[t];
      }

      if (*d < de)
        *(*d)++ = alphabet[q];

      delta /= 2;

      if (first) {
        delta /= 350;
        first = 0;
      }

      /* No overflow check is needed because |delta| was just
       * divided by 2 and |delta+delta >= delta + delta/h|.
       */
      h++;
      delta += delta / h;

      for (bias = 0; delta > 35 * 26 / 2; bias += 36)
        delta /= 35;

      bias += 36 * delta / (delta + 38);
      delta = 0;
      todo--;
    }

    delta++;
    n++;
  }

  return 0;
}